

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcPartialsPartialsAutoScaling
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          float *partials2,float *matrices2,int *activateScaling)

{
  float *pfVar1;
  float *pfVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int expTmp;
  int local_5c;
  float *local_58;
  float *local_50;
  float *local_48;
  float *local_40;
  float *local_38;
  
  iVar3 = this->kCategoryCount;
  if (0 < iVar3) {
    iVar5 = 0;
    iVar4 = this->kPatternCount;
    iVar10 = this->kPartialsPaddedStateCount;
    iVar7 = iVar10;
    local_58 = partials1;
    local_50 = partials2;
    local_48 = destP;
    local_40 = matrices1;
    local_38 = matrices2;
    do {
      if (0 < iVar4) {
        uVar11 = this->kStateCount;
        iVar3 = 0;
        uVar8 = iVar7 * iVar5 * iVar4;
        uVar9 = (ulong)uVar8;
        do {
          pfVar2 = local_50;
          pfVar1 = local_58;
          if (0 < (int)uVar11) {
            uVar9 = (ulong)(int)uVar9;
            iVar10 = 0;
            iVar4 = this->kMatrixSize * iVar5;
            do {
              if ((int)uVar11 < 1) {
                fVar12 = 0.0;
              }
              else {
                auVar13 = ZEXT816(0);
                auVar14 = ZEXT816(0) << 0x40;
                uVar6 = 0;
                do {
                  auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)local_40[(long)iVar4 + uVar6]),
                                            ZEXT416((uint)pfVar1[(long)(int)uVar8 + uVar6]));
                  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)local_38[(long)iVar4 + uVar6]),
                                            ZEXT416((uint)pfVar2[(long)(int)uVar8 + uVar6]));
                  uVar6 = uVar6 + 1;
                } while (uVar11 != uVar6);
                fVar12 = auVar14._0_4_ * auVar13._0_4_;
                iVar4 = iVar4 + uVar11;
              }
              destP[uVar9] = fVar12;
              if (*activateScaling == 0) {
                frexp((double)fVar12,&local_5c);
                iVar7 = -local_5c;
                if (0 < local_5c) {
                  iVar7 = local_5c;
                }
                destP = local_48;
                if (this->scalingExponentThreshold < iVar7) {
                  *activateScaling = 1;
                  uVar11 = this->kStateCount;
                }
              }
              iVar4 = iVar4 + 1;
              uVar9 = uVar9 + 1;
              iVar10 = iVar10 + 1;
            } while (iVar10 < (int)uVar11);
            iVar4 = this->kPatternCount;
            iVar10 = this->kPartialsPaddedStateCount;
          }
          uVar8 = uVar8 + iVar10;
          iVar3 = iVar3 + 1;
        } while (iVar3 < iVar4);
        iVar3 = this->kCategoryCount;
        iVar7 = iVar10;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < iVar3);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartialsAutoScaling(REALTYPE* destP,
                                                               const REALTYPE* partials1,
                                                               const REALTYPE* matrices1,
                                                               const REALTYPE* partials2,
                                                               const REALTYPE* matrices2,
                                                               int* activateScaling) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*kPartialsPaddedStateCount*kPatternCount;
        int v = l*kPartialsPaddedStateCount*kPatternCount;
        for (int k = 0; k < kPatternCount; k++) {
            int w = l * kMatrixSize;
            for (int i = 0; i < kStateCount; i++) {
                REALTYPE sum1 = 0.0, sum2 = 0.0;
                for (int j = 0; j < kStateCount; j++) {
                    sum1 += matrices1[w] * partials1[v + j];
                    sum2 += matrices2[w] * partials2[v + j];
                    w++;
                }

                // increment for the extra column at the end
                w += T_PAD;

                destP[u] = sum1 * sum2;

                if (*activateScaling == 0) {
                    int expTmp;
                    frexp(destP[u], &expTmp);
                    if (abs(expTmp) > scalingExponentThreshold)
                        *activateScaling = 1;
                }

                u++;
            }
            u += P_PAD;
            v += kPartialsPaddedStateCount;
        }
    }
}